

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
               (void)

{
  uint *__args_2;
  Underlying_matrix *this;
  _Base_ptr p_Var1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  undefined1 *puVar4;
  pointer __args;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  undefined4 local_5e0 [2];
  undefined8 local_5d8;
  shared_count sStack_5d0;
  undefined8 local_5c8;
  uint local_5c0 [2];
  undefined8 *local_5b8;
  char **local_5b0;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  reducedMatrix;
  char *local_560;
  char *local_558;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>
  m;
  
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>
  ::Matrix(&m,9,5);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  this = &m.matrix_;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,2,(initializer_list<unsigned_int> *)&bars1,0);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,3,(initializer_list<unsigned_int> *)&bars1,0);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,5,(initializer_list<unsigned_int> *)&bars1,0);
  bars2._M_t._M_impl._0_8_ = 0x300000002;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,7,(initializer_list<unsigned_int> *)&bars1,-1);
  bars2._M_t._M_impl._0_8_ = 0x500000003;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,8,(initializer_list<unsigned_int> *)&bars1,-1);
  bars2._M_t._M_impl._0_8_ = 0x500000002;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,9,(initializer_list<unsigned_int> *)&bars1,-1);
  bars2._M_t._M_impl._0_8_ = 0x800000007;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 9;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 3;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,10,(initializer_list<unsigned_int> *)&bars1,-1);
  bars1._M_t._M_impl._0_8_ = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,0xb,(initializer_list<unsigned_int> *)&bars1,0);
  bars2._M_t._M_impl._0_8_ = 0xb00000003;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  bars1._M_t._M_impl._0_8_ = &bars2;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
              *)this,0xd,(initializer_list<unsigned_int> *)&bars1,-1);
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::emplace_back<>(&reducedMatrix);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::emplace_back<>(&reducedMatrix);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::emplace_back<>(&reducedMatrix);
  bars2._M_t._M_impl._0_8_ = 0x300000002;
  __l._M_len = 2;
  __l._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  bars2._M_t._M_impl._0_8_ = 0x500000003;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_00,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::emplace_back<>(&reducedMatrix);
  bars2._M_t._M_impl._0_8_ = 0x800000007;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 9;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_01,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::emplace_back<>(&reducedMatrix);
  bars2._M_t._M_impl._0_8_ = 0xb00000003;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&bars2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1,__l_02,
             (allocator_type *)&bars3);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&reducedMatrix,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&bars1);
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>
            (&reducedMatrix,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__args = m.matrix_.super_RU_pairing_option.barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var1 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      __args != m.matrix_.super_RU_pairing_option.barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
    __args_2 = &__args->death;
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars1,&__args->dim,&__args->birth,__args_2);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars2,&__args->dim,&__args->birth,__args_2);
    local_5c0[0] = *__args_2;
    local_5c8._0_4_ = __args->dim;
    local_5c8._4_4_ = __args->birth;
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_shifted_barcode2<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars3,(int *)&local_5c8,(uint *)((long)&local_5c8 + 4),local_5c0);
  }
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x6ca);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_5e0[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_1c0,0x6ca,1,2,&p_Var1[1]._M_parent,"std::get<0>(*it)",local_5e0,"0");
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x6cb);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_5e0[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_1f0,0x6cb,1,2,&p_Var1[1].field_0x4,"std::get<1>(*it)",local_5e0,"0");
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x6cd);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_5e0[0] = 0xffffffff;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_220,0x6cd,1,2,p_Var1 + 1,"std::get<2>(*it)",local_5e0,"-1");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x6cf);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_5e0[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_250,0x6cf,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_5e0,"0");
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x6d0);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_5e0[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_280,0x6d0,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_5e0,"1");
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290,0x6d1);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_5e0[0] = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_2b0,0x6d1,1,2,p_Var3 + 1,"std::get<2>(*it)",local_5e0,"3");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2c0,0x6d3);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_5e0[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_2e0,0x6d3,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_5e0,"0");
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x6d4);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_5e0[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_310,0x6d4,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_5e0,"2");
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x6d5);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_5e0[0] = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_340,0x6d5,1,2,p_Var3 + 1,"std::get<2>(*it)",local_5e0,"4");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x6d7);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_5e0[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_370,0x6d7,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_5e0,"0");
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x6d8);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_5e0[0] = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_3a0,0x6d8,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_5e0,"7");
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x6d9);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_5e0[0] = 8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_3d0,0x6d9,1,2,p_Var3 + 1,"std::get<2>(*it)",local_5e0,"8");
  p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x6db);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_5e0[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_400,0x6db,1,2,&p_Var3[1]._M_parent,"std::get<0>(*it)",local_5e0,"1");
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x6dc);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_5e0[0] = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_430,0x6dc,1,2,&p_Var3[1].field_0x4,"std::get<1>(*it)",local_5e0,"5");
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x6dd);
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001fef70;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = (char **)0x1ab21d;
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_5e0[0] = 6;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_5c8,&local_460,0x6dd,1,2,p_Var3 + 1,"std::get<2>(*it)",local_5e0,"6");
  puVar4 = (undefined1 *)std::_Rb_tree_increment(p_Var3);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_470,0x6df);
  local_5d8 = 0;
  sStack_5d0.pi_ = (sp_counted_base *)0x0;
  local_560 = "it == bars1.end()";
  local_558 = "";
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001ff170;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_5b0 = &local_560;
  local_5e0[0]._0_1_ = (_Rb_tree_header *)puVar4 == &bars1._M_t._M_impl.super__Rb_tree_header;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5d0);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0x6e1);
  local_5e0[0]._0_1_ = std::operator==(&bars1._M_t,&bars2._M_t);
  local_5d8 = 0;
  sStack_5d0.pi_ = (sp_counted_base *)0x0;
  local_560 = "bars1 == bars2";
  local_558 = "";
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001ff170;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_5b0 = &local_560;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5d0);
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d0,0x6e2);
  bVar2 = std::operator==(&bars1._M_t,&bars3._M_t);
  local_5e0[0] = CONCAT31(local_5e0[0]._1_3_,bVar2);
  local_5d8 = 0;
  sStack_5d0.pi_ = (sp_counted_base *)0x0;
  local_560 = "bars1 == bars3";
  local_558 = "";
  local_5c0[0] = local_5c0[0] & 0xffffff00;
  local_5c8 = &PTR__lazy_ostream_001ff170;
  local_5b8 = &boost::unit_test::lazy_ostream::inst;
  local_5b0 = &local_560;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_5d0);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&reducedMatrix);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true,_false,_true>_>
  ::~Matrix(&m);
  return;
}

Assistant:

void test_shifted_barcode2() {
  using C = typename Matrix::Column;
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  Matrix m(9, 5);
  if constexpr (is_z2<C>()) {
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(7, {2, 3});
    m.insert_boundary(8, {3, 5});
    m.insert_boundary(9, {2, 5});
    m.insert_boundary(10, {7, 8, 9});
    m.insert_boundary(11, {}, 0);
    m.insert_boundary(13, {3, 11});
  } else {
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(7, {{2, 1}, {3, 4}});
    m.insert_boundary(8, {{3, 1}, {5, 4}});
    m.insert_boundary(9, {{2, 1}, {5, 4}});
    m.insert_boundary(10, {{7, 1}, {8, 1}, {9, 4}});
    m.insert_boundary(11, {}, 0);
    m.insert_boundary(13, {{3, 1}, {11, 4}});
  }

  const auto& barcode = m.get_current_barcode();

  std::vector<witness_content<C> > reducedMatrix;
  if constexpr (is_z2<C>()) {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 3});
      reducedMatrix.push_back({3, 5});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({7, 8, 9});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({3, 11});
    } else {
      reducedMatrix.push_back({2});
      reducedMatrix.push_back({2, 3});
      reducedMatrix.push_back({2, 5});
      reducedMatrix.push_back({7});
      reducedMatrix.push_back({7, 8});
      reducedMatrix.push_back({7, 8, 9});
      reducedMatrix.push_back({10});
      reducedMatrix.push_back({2, 11});
      reducedMatrix.push_back({7, 13});
    }
  } else {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {3, 4}});
      reducedMatrix.push_back({{3, 1}, {5, 4}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{7, 1}, {8, 1}, {9, 4}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{3, 1}, {11, 4}});
    } else {
      reducedMatrix.push_back({{2, 1}});
      reducedMatrix.push_back({{2, 1}, {3, 4}});
      reducedMatrix.push_back({{2, 1}, {5, 4}});
      reducedMatrix.push_back({{7, 1}});
      reducedMatrix.push_back({{7, 1}, {8, 1}});
      reducedMatrix.push_back({{7, 1}, {8, 1}, {9, 4}});
      reducedMatrix.push_back({{10, 1}});
      reducedMatrix.push_back({{2, 1}, {11, 4}});
      reducedMatrix.push_back({{7, 1}, {13, 1}});
    }
  }
  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    test_column_equality<C>(reducedMatrix[0], get_column_content_via_iterators(m.get_column(2)));
    test_column_equality<C>(reducedMatrix[1], get_column_content_via_iterators(m.get_column(3)));
    test_column_equality<C>(reducedMatrix[2], get_column_content_via_iterators(m.get_column(5)));
    test_column_equality<C>(reducedMatrix[3], get_column_content_via_iterators(m.get_column(7)));
    test_column_equality<C>(reducedMatrix[4], get_column_content_via_iterators(m.get_column(8)));
    test_column_equality<C>(reducedMatrix[5], get_column_content_via_iterators(m.get_column(9)));
    test_column_equality<C>(reducedMatrix[6], get_column_content_via_iterators(m.get_column(10)));
    test_column_equality<C>(reducedMatrix[7], get_column_content_via_iterators(m.get_column(11)));
    test_column_equality<C>(reducedMatrix[8], get_column_content_via_iterators(m.get_column(13)));
  } else {
    test_content_equality(reducedMatrix, m);
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}